

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O2

void __thiscall Alice::ObliviousTranslate(Alice *this)

{
  long *plVar1;
  long lVar2;
  Alice *pAVar3;
  Message MVar4;
  Message local_d0;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_c0;
  undefined1 local_a8 [8];
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> Perm_D;
  _Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_78;
  _Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_60;
  _Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_48;
  undefined1 local_30 [8];
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> Perm_P;
  
  pAVar3 = (Alice *)&(this->super_Party).P;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector(&local_c0,
           (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)pAVar3);
  ExtractPermutationShare
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_30,
             pAVar3,&local_c0,(this->super_Party).n_p,5);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector(&local_c0);
  pAVar3 = (Alice *)&(this->super_Party).D;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)&Perm_D.
               super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,
           (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)pAVar3);
  ExtractPermutationShare
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_a8,
             pAVar3,(vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     *)&Perm_D.
                        super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(this->super_Party).n_d,2
            );
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)&Perm_D.
                super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)&local_78,
             (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_30);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)&local_60,
             (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_a8);
  ObliviousTranslate(this,(vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                          &local_78,
                     (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                     &local_60);
  std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~_Vector_base
            (&local_60);
  std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~_Vector_base
            (&local_78);
  lVar2 = (this->super_Party).pc;
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)&local_48,
             (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_30);
  lVar2 = ObliviousTranslateSingleAddress
                    (this,lVar2,
                     (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                     &local_48);
  (this->super_Party).pc = lVar2;
  std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~_Vector_base
            (&local_48);
  local_d0.scalar2 = 0;
  local_d0.scalar1 = (this->super_Party).pc;
  Server::Send(this->srv,&local_d0);
  MVar4 = Server::Receive(this->srv);
  plVar1 = &(this->super_Party).pc;
  *plVar1 = *plVar1 + MVar4.scalar1;
  UpdateAlphas(this);
  std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~_Vector_base
            ((_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             local_a8);
  std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~_Vector_base
            ((_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             local_30);
  return;
}

Assistant:

void Alice::ObliviousTranslate()
{
    std::vector<std::pair<long,long>> Perm_P = ExtractPermutationShare(P, n_p, 5);
    std::vector<std::pair<long,long>> Perm_D = ExtractPermutationShare(D, n_d, 2);
    ObliviousTranslate(Perm_P, Perm_D);
    pc = ObliviousTranslateSingleAddress(pc, Perm_P);
    Message msg_for_Bob, msg_from_Bob;
    msg_for_Bob.scalar1 = pc;
    srv->Send(msg_for_Bob);
    msg_from_Bob = srv->Receive();
    pc = pc + msg_from_Bob.scalar1;
    UpdateAlphas();  
}